

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int bb_i2c_zip(uint SDA,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  gpioExtent_t *in_RCX;
  undefined8 in_RSI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fb8;
  int in_stack_00000fbc;
  void *in_stack_00000fc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_28;
  int in_stack_ffffffffffffffe8;
  
  local_28 = pigpio_command_ext(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                                in_stack_ffffffffffffffc8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,0
                                ,in_RCX,in_stack_ffffffffffffffe8);
  if (0 < local_28) {
    local_28 = recvMax(in_stack_00000fc0,in_stack_00000fbc,in_stack_00000fb8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_28;
}

Assistant:

int bb_i2c_zip(
   unsigned SDA,
   char    *inBuf,
   unsigned inLen,
   char    *outBuf,
   unsigned outLen)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=SDA
   p2=0
   p3=inLen
   ## extension ##
   char inBuf[inLen]
   */

   ext[0].size = inLen;
   ext[0].ptr = inBuf;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_BI2CZ, SDA, 0, inLen, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(outBuf, outLen, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}